

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  uint uVar3;
  long in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  int max;
  int count;
  uint start;
  int previousIs0;
  uint alphabetSize;
  uint symbol;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int tableSize;
  int nbBits;
  BYTE *oend;
  BYTE *out;
  BYTE *ostart;
  int local_80;
  int local_74;
  uint local_70;
  uint local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_4c;
  undefined1 *local_40;
  undefined1 *local_8;
  
  local_58 = 1 << ((byte)in_R8D & 0x1f);
  local_64 = 0;
  uVar1 = in_ECX + 1;
  bVar4 = false;
  local_5c = in_R8D - 5;
  local_60 = 4;
  local_54 = local_58 + 1;
  local_4c = in_R8D + 1;
  local_40 = in_RDI;
  while (local_64 < uVar1 && 1 < local_54) {
    iVar2 = local_60;
    if (bVar4) {
      local_70 = local_64;
      while( true ) {
        bVar4 = false;
        if (local_64 < uVar1) {
          bVar4 = *(short *)(in_RDX + (ulong)local_64 * 2) == 0;
        }
        if (!bVar4) break;
        local_64 = local_64 + 1;
      }
      if (local_64 == uVar1) break;
      while (local_70 + 0x18 <= local_64) {
        local_70 = local_70 + 0x18;
        local_5c = (0xffff << ((byte)local_60 & 0x1f)) + local_5c;
        if ((in_R9D == 0) && (in_RDI + in_RSI + -2 < local_40)) {
          return 0xffffffffffffffba;
        }
        *local_40 = (char)local_5c;
        local_40[1] = (char)(local_5c >> 8);
        local_40 = local_40 + 2;
        local_5c = local_5c >> 0x10;
      }
      for (; local_70 + 3 <= local_64; local_70 = local_70 + 3) {
        local_5c = (3 << ((byte)local_60 & 0x1f)) + local_5c;
        local_60 = local_60 + 2;
      }
      local_5c = (local_64 - local_70 << ((byte)local_60 & 0x1f)) + local_5c;
      iVar2 = local_60 + 2;
      if (0x10 < local_60 + 2) {
        if ((in_R9D == 0) && (in_RDI + in_RSI + -2 < local_40)) {
          return 0xffffffffffffffba;
        }
        *local_40 = (char)local_5c;
        local_40[1] = (char)(local_5c >> 8);
        local_40 = local_40 + 2;
        local_5c = local_5c >> 0x10;
        iVar2 = local_60 + -0xe;
      }
    }
    local_60 = iVar2;
    uVar3 = local_64 + 1;
    local_74 = (int)*(short *)(in_RDX + (ulong)local_64 * 2);
    iVar2 = (local_58 * 2 + -1) - local_54;
    local_80 = local_74;
    if (local_74 < 0) {
      local_80 = -local_74;
    }
    local_54 = local_54 - local_80;
    local_74 = local_74 + 1;
    if (local_58 <= local_74) {
      local_74 = iVar2 + local_74;
    }
    local_5c = (local_74 << ((byte)local_60 & 0x1f)) + local_5c;
    local_60 = (local_4c + local_60) - (uint)(local_74 < iVar2);
    bVar4 = local_74 == 1;
    if (local_54 < 1) {
      return 0xffffffffffffffff;
    }
    for (; local_54 < local_58; local_58 = local_58 >> 1) {
      local_4c = local_4c + -1;
    }
    local_64 = uVar3;
    if (0x10 < local_60) {
      if ((in_R9D == 0) && (in_RDI + in_RSI + -2 < local_40)) {
        return 0xffffffffffffffba;
      }
      *local_40 = (char)local_5c;
      local_40[1] = (char)(local_5c >> 8);
      local_40 = local_40 + 2;
      local_5c = local_5c >> 0x10;
      local_60 = local_60 + -0x10;
    }
  }
  if (local_54 == 1) {
    if (uVar1 < local_64) {
      __assert_fail("symbol <= alphabetSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x38ef,
                    "size_t FSE_writeNCount_generic(void *, size_t, const short *, unsigned int, unsigned int, unsigned int)"
                   );
    }
    if ((in_R9D == 0) && (in_RDI + in_RSI + -2 < local_40)) {
      local_8 = (undefined1 *)0xffffffffffffffba;
    }
    else {
      *local_40 = (char)local_5c;
      local_40[1] = (char)(local_5c >> 8);
      local_8 = local_40 + ((long)((local_60 + 7) / 8) - (long)in_RDI);
    }
  }
  else {
    local_8 = (undefined1 *)0xffffffffffffffff;
  }
  return (size_t)local_8;
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    return (out-ostart);
}